

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

NestedTestAllTypes *
google::protobuf::Arena::
CreateArenaCompatible<proto2_unittest::NestedTestAllTypes,proto2_unittest::NestedTestAllTypes>
          (Arena *arena,NestedTestAllTypes *args)

{
  NestedTestAllTypes *args_local;
  Arena *arena_local;
  
  if (arena == (Arena *)0x0) {
    arena_local = (Arena *)operator_new(0x50);
    proto2_unittest::NestedTestAllTypes::NestedTestAllTypes
              ((NestedTestAllTypes *)arena_local,(Arena *)0x0,args);
  }
  else {
    arena_local = (Arena *)DoCreateMessage<proto2_unittest::NestedTestAllTypes,proto2_unittest::NestedTestAllTypes>
                                     (arena,args);
  }
  return (NestedTestAllTypes *)arena_local;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  CreateArenaCompatible(Arena* PROTOBUF_NULLABLE arena, Args&&... args) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (ABSL_PREDICT_FALSE(arena == nullptr)) {
      return new T(nullptr, static_cast<Args&&>(args)...);
    } else {
      return arena->DoCreateMessage<T>(static_cast<Args&&>(args)...);
    }
  }